

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O1

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  pointer pcVar1;
  _Elt_pointer pvVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  string *arg;
  pointer pbVar7;
  pointer lff_00;
  bool bVar8;
  cmExecutionStatus status;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> fb;
  string oldDef;
  cmExecutionStatus local_6c;
  _Map_pointer local_68;
  char *local_60;
  _Elt_pointer local_58;
  char local_50;
  undefined7 uStack_4f;
  pointer local_40;
  cmExecutionStatus *local_38;
  
  local_38 = inStatus;
  iVar5 = std::__cxx11::string::compare((char *)lff);
  if (iVar5 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)lff);
    if (iVar5 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffff98,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        bVar8 = local_68 != (_Map_pointer)0x0;
        if (bVar8) {
          local_60 = &stack0xffffffffffffffb0;
          local_58 = (_Elt_pointer)0x0;
          local_50 = '\0';
          pcVar6 = cmMakefile::GetDefinition
                             (mf,(this->Args).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          if (pcVar6 != (char *)0x0) {
            pcVar6 = cmMakefile::GetDefinition
                               (mf,(this->Args).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
            pvVar2 = local_58;
            strlen(pcVar6);
            std::__cxx11::string::_M_replace
                      ((ulong)&stack0xffffffffffffffa0,0,(char *)pvVar2,(ulong)pcVar6);
          }
          local_40 = (this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pbVar7 = (this->Args).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
          if (pbVar7 != local_40) {
            do {
              cmMakefile::AddDefinition
                        (mf,(this->Args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(pbVar7->_M_dataplus)._M_p);
              local_6c.ReturnInvoked = false;
              local_6c.BreakInvoked = false;
              local_6c.ContinueInvoked = false;
              local_6c.NestedError = false;
              lff_00 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pcVar1 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (lff_00 != pcVar1) {
                do {
                  local_6c.ReturnInvoked = false;
                  local_6c.BreakInvoked = false;
                  local_6c.ContinueInvoked = false;
                  local_6c.NestedError = false;
                  cmMakefile::ExecuteCommand(mf,lff_00,&local_6c);
                  if (local_6c.ReturnInvoked == true) {
                    local_38->ReturnInvoked = true;
LAB_002c9825:
                    cmMakefile::AddDefinition
                              (mf,(this->Args).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,local_60);
                    cVar3 = '\x01';
LAB_002c983b:
                    bVar4 = 0;
                  }
                  else {
                    if (local_6c.BreakInvoked == true) goto LAB_002c9825;
                    if (local_6c.ContinueInvoked != false) {
                      cVar3 = '\x04';
                      goto LAB_002c983b;
                    }
                    cVar3 = true;
                    if (cmSystemTools::s_FatalErrorOccured == false) {
                      cVar3 = cmSystemTools::GetInterruptFlag();
                    }
                    bVar4 = cVar3 ^ 1;
                  }
                  if (bVar4 == 0) goto LAB_002c9879;
                  lff_00 = lff_00 + 1;
                } while (lff_00 != pcVar1);
                cVar3 = '\x04';
LAB_002c9879:
                if (cVar3 != '\x04') goto LAB_002c989e;
              }
              pbVar7 = pbVar7 + 1;
            } while (pbVar7 != local_40);
          }
          cmMakefile::AddDefinition
                    (mf,(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,local_60);
LAB_002c989e:
          if (local_60 != &stack0xffffffffffffffb0) {
            operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
          }
        }
        if (local_68 == (_Map_pointer)0x0) {
          return bVar8;
        }
        (*(code *)(*local_68)[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)();
        return bVar8;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                                 cmMakefile& mf,
                                                 cmExecutionStatus& inStatus)
{
  if (lff.Name.Lower == "foreach") {
    // record the number of nested foreach commands
    this->Depth++;
  } else if (lff.Name.Lower == "endforeach") {
    // if this is the endofreach for this statement
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0])) {
        oldDef = mf.GetDefinition(this->Args[0]);
      }

      for (std::string const& arg : cmMakeRange(this->Args).advance(1)) {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0], arg.c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for (cmListFileFunction const& func : this->Functions) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetBreakInvoked()) {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
      }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0], oldDef.c_str());
      return true;
    }
    // close out a nested foreach
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}